

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

int __thiscall
ON_Mesh::GetVertexEdges
          (ON_Mesh *this,int vertex_index_count,int *vertex_index,bool bNoDuplicates,
          ON_SimpleArray<ON_2dex> *edges)

{
  uint uVar1;
  uint uVar2;
  ON_MeshTopologyEdge *pOVar3;
  ON_SimpleArray<ON_2dex> *pOVar4;
  ON_MeshFace *pOVar5;
  uint uVar6;
  int iVar7;
  int *piVar8;
  undefined7 in_register_00000009;
  long lVar9;
  ulong uVar10;
  ON_MeshFace *pOVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  ON_MeshTopologyVertex *pOVar15;
  ulong uVar16;
  long lVar17;
  ON_2dex edge_ends;
  ON_Workspace ws;
  ON_2dex local_b0;
  int *local_a8;
  ON_SimpleArray<ON_2dex> *local_a0;
  ulong local_98;
  ON_MeshFace *local_90;
  undefined4 local_84;
  int local_80;
  uint local_7c;
  ulong local_78;
  long local_70;
  int *local_68;
  ulong local_60;
  ON_Mesh *local_58;
  ON_MeshTopologyVertex *local_50;
  ulong local_48;
  ON_Workspace local_40;
  
  uVar1 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  iVar12 = 0;
  iVar7 = 0;
  if ((((2 < (int)uVar1) &&
       (uVar16 = (ulong)(uint)vertex_index_count, iVar7 = iVar12, 0 < vertex_index_count)) &&
      (vertex_index != (int *)0x0)) &&
     (uVar13 = (this->m_F).m_count, local_78 = (ulong)uVar13, 0 < (int)uVar13)) {
    local_70 = (long)edges->m_count;
    local_90 = (this->m_F).m_a;
    local_84 = (undefined4)CONCAT71(in_register_00000009,bNoDuplicates);
    local_a8 = vertex_index;
    local_a0 = edges;
    if ((((this->m_top).m_b32IsValid == 1) && (uVar1 == (this->m_top).m_topv_map.m_count)) &&
       (uVar13 = (this->m_top).m_tope.m_count, 0 < (int)uVar13)) {
      local_68 = (this->m_top).m_topv_map.m_a;
      local_80 = (this->m_top).m_topv.m_count;
      uVar10 = 0;
      local_7c = uVar13;
      local_60 = uVar16;
      local_58 = this;
      do {
        uVar6 = local_a8[uVar10];
        local_48 = uVar10;
        if (uVar6 < uVar1) {
          lVar9 = (long)local_68[uVar6];
          if ((-1 < lVar9) && (local_68[uVar6] <= local_80)) {
            pOVar15 = (this->m_top).m_topv.m_a;
            iVar7 = pOVar15[lVar9].m_tope_count;
            if (0 < iVar7) {
              pOVar15 = pOVar15 + lVar9;
              uVar16 = 0;
              local_50 = pOVar15;
              do {
                uVar2 = pOVar15->m_topei[uVar16];
                if ((uVar2 < uVar13) &&
                   (pOVar3 = (this->m_top).m_tope.m_a, 0 < pOVar3[uVar2].m_topf_count)) {
                  lVar9 = 0;
                  local_98 = uVar16;
                  do {
                    pOVar11 = local_90;
                    uVar13 = pOVar3[uVar2].m_topfi[lVar9];
                    if (uVar13 < (uint)local_78) {
                      lVar17 = 3;
                      do {
                        if (local_90[uVar13].vi[lVar17 + -3] == uVar6) {
                          local_b0.i = local_90[uVar13].vi[(uint)lVar17 & 3];
                          if (uVar6 != local_b0.i && (uint)local_b0.i < uVar1) {
                            local_b0.j = uVar6;
                            ON_SimpleArray<ON_2dex>::Append(local_a0,&local_b0);
                          }
                          if ((lVar17 == 5) && (pOVar11[uVar13].vi[2] == pOVar11[uVar13].vi[3])) {
                            uVar16 = 0;
                          }
                          else {
                            uVar16 = (ulong)((uint)lVar17 - 2 & 3);
                          }
                          local_b0.j = pOVar11[uVar13].vi[uVar16];
                          if (uVar6 != local_b0.j && (uint)local_b0.j < uVar1) {
                            local_b0.i = uVar6;
                            ON_SimpleArray<ON_2dex>::Append(local_a0,&local_b0);
                          }
                          break;
                        }
                        lVar17 = lVar17 + 1;
                      } while (lVar17 != 7);
                    }
                    lVar9 = lVar9 + 1;
                  } while (lVar9 < pOVar3[uVar2].m_topf_count);
                  iVar7 = local_50->m_tope_count;
                  this = local_58;
                  pOVar15 = local_50;
                  uVar16 = local_98;
                  uVar13 = local_7c;
                }
                uVar16 = uVar16 + 1;
              } while ((long)uVar16 < (long)iVar7);
            }
          }
        }
        uVar10 = local_48 + 1;
      } while (uVar10 != local_60);
    }
    else {
      ON_Workspace::ON_Workspace(&local_40);
      if (1 < (uint)vertex_index_count) {
        uVar10 = 1;
        do {
          if (local_a8[uVar10] < local_a8[uVar10 - 1]) {
            piVar8 = ON_Workspace::GetIntMemory(&local_40,uVar16);
            memcpy(piVar8,local_a8,uVar16 * 4);
            ON_SortIntArray(quick_sort,piVar8,uVar16);
            local_a8 = piVar8;
            break;
          }
          uVar10 = uVar10 + 1;
        } while (uVar16 != uVar10);
      }
      uVar10 = 0;
      pOVar11 = local_90;
      do {
        pOVar5 = local_90;
        lVar9 = 3;
        local_98 = uVar10;
        do {
          uVar13 = pOVar11->vi[lVar9 + -3];
          piVar8 = ON_BinarySearchIntArray(uVar13,local_a8,uVar16);
          if (piVar8 != (int *)0x0) {
            uVar6 = pOVar5[uVar10].vi[(uint)lVar9 & 3];
            if ((uVar6 < uVar1) && (uVar13 != uVar6)) {
              local_b0.j = uVar13;
              local_b0.i = uVar6;
              ON_SimpleArray<ON_2dex>::Append(local_a0,&local_b0);
            }
            if ((lVar9 == 5) && (pOVar5[uVar10].vi[2] == pOVar5[uVar10].vi[3])) {
              uVar6 = 0;
            }
            else {
              uVar6 = (uint)lVar9 - 2 & 3;
            }
            uVar6 = pOVar5[uVar10].vi[uVar6];
            if ((uVar6 < uVar1) && (uVar13 != uVar6)) {
              local_b0.j = uVar6;
              local_b0.i = uVar13;
              ON_SimpleArray<ON_2dex>::Append(local_a0,&local_b0);
            }
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != 7);
        uVar10 = local_98 + 1;
        pOVar11 = pOVar11 + 1;
      } while (uVar10 != local_78);
      ON_Workspace::~ON_Workspace(&local_40);
    }
    lVar9 = local_70;
    pOVar4 = local_a0;
    iVar7 = local_a0->m_count;
    iVar12 = (int)local_70;
    lVar17 = local_70;
    if ((iVar12 < iVar7 & (byte)local_84) == 1) {
      do {
        local_b0 = local_a0->m_a[lVar17];
        iVar14 = local_b0.j;
        if (iVar14 < local_b0.i) {
          local_b0.j = local_b0.i;
          local_b0.i = iVar14;
          local_a0->m_a[lVar17] = local_b0;
          iVar7 = local_a0->m_count;
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 < iVar7);
      ON_qsort(local_a0->m_a + local_70,(long)(iVar7 - iVar12),8,ON_MeshGetVertexEdges_Compare2dex);
      local_b0 = pOVar4->m_a[lVar9];
      uVar16 = lVar9 + 1;
      iVar7 = pOVar4->m_count;
      iVar14 = (int)uVar16;
      if (iVar14 < iVar7) {
        lVar9 = uVar16 * 8;
        uVar10 = uVar16 & 0xffffffff;
        do {
          iVar7 = ON_Compare2dex(&local_b0,(ON_2dex *)((long)&pOVar4->m_a->i + lVar9));
          if (iVar7 != 0) {
            local_b0 = *(ON_2dex *)((long)&pOVar4->m_a->i + lVar9);
            iVar7 = (int)uVar10;
            if ((int)uVar16 != iVar7) {
              pOVar4->m_a[iVar7] = local_b0;
            }
            uVar10 = (ulong)(iVar7 + 1);
          }
          iVar14 = (int)uVar10;
          uVar16 = uVar16 + 1;
          iVar7 = pOVar4->m_count;
          lVar9 = lVar9 + 8;
        } while ((long)uVar16 < (long)iVar7);
      }
      if ((-1 < iVar14) && (iVar14 <= pOVar4->m_capacity)) {
        pOVar4->m_count = iVar14;
        iVar7 = iVar14;
      }
    }
    iVar7 = iVar7 - iVar12;
  }
  return iVar7;
}

Assistant:

int ON_Mesh::GetVertexEdges( 
  int vertex_index_count,
  const int* vertex_index, 
  bool bNoDuplicates,
  ON_SimpleArray<ON_2dex>& edges
  ) const
{
  // Get edges connected to vertices in vertex_index[] array.
  const int edges_count0 = edges.Count();

  const int mesh_vcount = m_V.Count();

  //03/12/2007 TimH. The line below appears to be a typo.  Using the following line works better.
  //const int mesh_fcount = m_V.Count();
  const int mesh_fcount = m_F.Count();

  if (   vertex_index_count <= 0 || 0 == vertex_index 
      || mesh_fcount <= 0 || mesh_vcount < 3 )
  {
    return 0;
  }

  int vei, efi, fvi, ei, fi, j, n, vi;
  const int* f_vi;
  ON_2dex edge_ends;
  const ON_MeshFace* f = m_F.Array();

  if (   TopologyExists()
       && mesh_vcount == m_top.m_topv_map.Count()
       && m_top.m_tope.Count() > 0 )
  {
    // Topology looks good; use it to speed up the search.
    const int* topv_map = m_top.m_topv_map;
    const int top_vcount = m_top.m_topv.Count();
    const int top_ecount = m_top.m_tope.Count();
    int top_vi;
    for ( n = 0; n < vertex_index_count; n++ )
    {
      vi = vertex_index[n];
      if ( vi < 0 || vi >= mesh_vcount )
        continue;
      top_vi = topv_map[vi];
      if ( top_vi < 0 || top_vi > top_vcount )
        continue;
      edge_ends.i = vi;
      const ON_MeshTopologyVertex& v = m_top.m_topv[top_vi];
      for ( vei = 0; vei < v.m_tope_count; vei++ )
      {
        ei = v.m_topei[vei];
        if ( ei < 0 || ei >= top_ecount )
          continue;
        const ON_MeshTopologyEdge& e = m_top.m_tope[ei];
        for ( efi = 0; efi < e.m_topf_count; efi++ )
        {
          fi = e.m_topfi[efi];
          if ( fi < 0 || fi >= mesh_fcount )
            continue;
          f_vi = f[fi].vi;
          for ( fvi = 0; fvi < 4; fvi++ )
          {
            if ( f_vi[fvi] == vi )
            {
              j = f_vi[(fvi+3)%4];
              if ( j >= 0 && j < mesh_vcount && vi != j )
              {
                edge_ends.i = j;
                edge_ends.j = vi;
                edges.Append(edge_ends);
              }
              j = f_vi[ (2==fvi && f_vi[2]==f_vi[3]) ? 0 : ((fvi+1)%4) ];
              if ( j >= 0 && j < mesh_vcount && vi != j )
              {
                edge_ends.i = vi;
                edge_ends.j = j;
                edges.Append(edge_ends);
              }
              break; // done with this face
            }
          }
        }
      }
    }
  }
  else
  {
    // slow-n-stupid search through all the faces

    // Sort vertex_index[] array so we can use a quick
    // binary search to see if a face is using one of 
    // the vertices in the list.
    ON_Workspace ws;
    for ( vi = 1; vi < vertex_index_count; vi++ )
    {
      if ( vertex_index[vi] < vertex_index[vi-1] )
      {
        // need to sort vertex_index[] array
        int* tmp = ws.GetIntMemory(vertex_index_count);
        memcpy(tmp,vertex_index,vertex_index_count*sizeof(tmp[0]));
        ON_SortIntArray(ON::sort_algorithm::quick_sort,tmp,vertex_index_count);
        vertex_index = tmp;
        break;
      }
    }

    // Find all the faces that use a vertex in the vertex_index[] array.
    for ( fi = 0; fi < mesh_fcount; fi++ )
    {
      f_vi = f[fi].vi;
      for ( fvi = 0; fvi < 4; fvi++ )
      {
        vi = f_vi[fvi];
        if ( ON_BinarySearchIntArray(vi,vertex_index,vertex_index_count) )
        {
          // vi is in the vertex_index[] array.  Add the edges
          // of this face that begin and end at this vertex.
          j = f_vi[(fvi+3)%4];
          if ( j >= 0 && j < mesh_vcount && vi != j )
          {
            edge_ends.i = j;
            edge_ends.j = vi;
            edges.Append(edge_ends);
          }
          j = f_vi[ (2==fvi && f_vi[2]==f_vi[3]) ? 0 : ((fvi+1)%4) ];
          if ( j >= 0 && j < mesh_vcount && vi != j )
          {
            edge_ends.i = vi;
            edge_ends.j = j;
            edges.Append(edge_ends);
          }
        }
      }
    }
  }

  if ( bNoDuplicates && edges.Count() > edges_count0 )
  {
    for ( ei = edges_count0; ei < edges.Count(); ei++ )
    {
      edge_ends = edges[ei];
      if ( edge_ends.i > edge_ends.j )
      {
        j = edge_ends.i; edge_ends.i = edge_ends.j; edge_ends.j = j;
        edges[ei] = edge_ends;
      }
    }
    ON_qsort( edges.Array() + edges_count0,
              edges.Count() - edges_count0,
              sizeof(edge_ends), 
              ON_MeshGetVertexEdges_Compare2dex);
    edge_ends = edges[edges_count0];
    for ( ei = j = edges_count0+1; ei < edges.Count(); ei++ )
    {
      if ( ON_Compare2dex(&edge_ends,&edges[ei]) )
      {
        edge_ends = edges[ei];
        if ( j != ei )
          edges[j] = edge_ends;
        j++;
      }
    }
    edges.SetCount(j);
  }

  return (edges.Count() - edges_count0);
}